

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::ColumnDependencyManager::IsDependencyOf
          (ColumnDependencyManager *this,LogicalIndex gcol,LogicalIndex col)

{
  __node_base_ptr p_Var1;
  size_type sVar2;
  bool bVar3;
  key_type local_18;
  key_type local_10;
  
  bVar3 = false;
  local_18.index = col.index;
  local_10.index = gcol.index;
  p_Var1 = ::std::
           _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->dependents_map)._M_h,
                      gcol.index % (this->dependents_map)._M_h._M_bucket_count,&local_10,gcol.index)
  ;
  if (p_Var1 != (__node_base_ptr)0x0) {
    if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
      bVar3 = false;
    }
    else {
      sVar2 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)(p_Var1->_M_nxt + 2),&local_18);
      bVar3 = sVar2 != 0;
    }
  }
  return bVar3;
}

Assistant:

bool ColumnDependencyManager::IsDependencyOf(LogicalIndex gcol, LogicalIndex col) const {
	auto entry = dependents_map.find(gcol);
	if (entry == dependents_map.end()) {
		return false;
	}
	auto &list = entry->second;
	return list.count(col);
}